

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costFirstPartialDerivativeWRTControl
          (QuadraticLikeCost *this,double time,VectorDynSize *param_2,VectorDynSize *control,
          VectorDynSize *partialDerivative)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  element_type *peVar5;
  element_type *peVar6;
  double dVar7;
  Index size_1;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  Index size;
  bool isValid;
  type tmp;
  ostringstream errorMsg;
  char local_1f9;
  long *local_1f8 [2];
  long local_1e8 [2];
  double local_1d8;
  PointerType local_1d0;
  PointerType local_1c8;
  long local_1c0;
  long local_1b8;
  PointerType local_1b0;
  undefined1 local_1a8 [112];
  PointerType local_138;
  variable_if_dynamic<long,__1> local_130;
  
  local_1d8 = time;
  iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::resize((ulong)partialDerivative);
  iDynTree::VectorDynSize::zero();
  local_1f9 = '\0';
  peVar5 = (this->m_timeVaryingControlHessian).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar5 != (element_type *)0x0) {
    (*peVar5->_vptr_TimeVaryingObject[2])(local_1d8,peVar5,&local_1f9);
    if (local_1f9 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unable to retrieve a valid control hessian at time: ",0x34);
      poVar12 = std::ostream::_M_insert<double>(local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,".",1);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("QuadraticLikeCost","costFirstPartialDerivativeWRTControl",(char *)local_1f8[0]);
      goto LAB_001642d0;
    }
    lVar8 = iDynTree::MatrixDynSize::rows();
    lVar9 = iDynTree::MatrixDynSize::cols();
    if (lVar8 != lVar9) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The control hessian at time: ",0x1d);
      poVar12 = std::ostream::_M_insert<double>(local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," is not squared.",0x10);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("QuadraticLikeCost","costFirstPartialDerivativeWRTControl",(char *)local_1f8[0]);
      goto LAB_001642d0;
    }
    lVar8 = iDynTree::MatrixDynSize::rows();
    lVar9 = iDynTree::VectorDynSize::size();
    if (lVar8 != lVar9) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The hessian at time: ",0x15);
      poVar12 = std::ostream::_M_insert<double>(local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," does not match the control dimension.",0x26);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("QuadraticLikeCost","costFirstPartialDerivativeWRTControl",(char *)local_1f8[0]);
      goto LAB_001642d0;
    }
    local_1b0 = (PointerType)iDynTree::MatrixDynSize::data();
    local_1b8 = iDynTree::MatrixDynSize::rows();
    local_1c0 = iDynTree::MatrixDynSize::cols();
    local_1c8 = (PointerType)iDynTree::MatrixDynSize::data();
    lVar8 = iDynTree::MatrixDynSize::rows();
    lVar9 = iDynTree::MatrixDynSize::cols();
    local_1d0 = (PointerType)iDynTree::VectorDynSize::data();
    local_130.m_value = iDynTree::VectorDynSize::size();
    local_1a8._24_8_ = 0.5;
    local_1a8._32_8_ = local_1b0;
    local_1a8._40_8_ = local_1b8;
    local_1a8._48_8_ = local_1c0;
    local_1a8._64_8_ = local_1c8;
    local_138 = local_1d0;
    local_1a8._8_8_ = lVar9;
    local_1a8._16_8_ = lVar8;
    local_1a8._72_8_ = lVar8;
    local_1a8._80_8_ = lVar9;
    uVar10 = iDynTree::VectorDynSize::data();
    uVar11 = iDynTree::VectorDynSize::size();
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>>const>const>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,0>>
              ((Matrix<double,_1,1,0,_1,1> *)local_1f8,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)local_1a8);
    uVar13 = uVar11;
    if (((uVar10 & 7) == 0) &&
       (uVar13 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar11 <= (long)uVar13)) {
      uVar13 = uVar11;
    }
    lVar8 = uVar11 - uVar13;
    if (0 < (long)uVar13) {
      uVar14 = 0;
      do {
        *(double *)(uVar10 + uVar14 * 8) =
             (double)local_1f8[0][uVar14] + *(double *)(uVar10 + uVar14 * 8);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    uVar14 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
    if (1 < lVar8) {
      do {
        dVar7 = (double)(local_1f8[0] + uVar13)[1];
        pdVar1 = (double *)(uVar10 + uVar13 * 8);
        dVar4 = pdVar1[1];
        pdVar2 = (double *)(uVar10 + uVar13 * 8);
        *pdVar2 = (double)local_1f8[0][uVar13] + *pdVar1;
        pdVar2[1] = dVar7 + dVar4;
        uVar13 = uVar13 + 2;
      } while ((long)uVar13 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar11) {
      do {
        *(double *)(uVar10 + uVar14 * 8) =
             (double)local_1f8[0][uVar14] + *(double *)(uVar10 + uVar14 * 8);
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
    }
    free(local_1f8[0]);
  }
  peVar6 = (this->m_timeVaryingControlGradient).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar6 == (element_type *)0x0) {
    return true;
  }
  local_1f9 = '\0';
  (*peVar6->_vptr_TimeVaryingObject[2])(local_1d8,peVar6,&local_1f9);
  if (local_1f9 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unable to retrieve a valid control gradient at time: ",0x35);
    poVar12 = std::ostream::_M_insert<double>(local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,".",1);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              ("QuadraticLikeCost","costFirstPartialDerivativeWRTControl",(char *)local_1f8[0]);
  }
  else {
    lVar8 = iDynTree::VectorDynSize::size();
    lVar9 = iDynTree::VectorDynSize::size();
    if (lVar8 == lVar9) {
      lVar8 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      uVar10 = iDynTree::VectorDynSize::data();
      uVar11 = iDynTree::VectorDynSize::size();
      uVar13 = uVar11;
      if (((uVar10 & 7) == 0) &&
         (uVar13 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar11 <= (long)uVar13)) {
        uVar13 = uVar11;
      }
      lVar9 = uVar11 - uVar13;
      if (0 < (long)uVar13) {
        uVar14 = 0;
        do {
          *(double *)(uVar10 + uVar14 * 8) =
               *(double *)(lVar8 + uVar14 * 8) + *(double *)(uVar10 + uVar14 * 8);
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      uVar14 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
      if (1 < lVar9) {
        do {
          pdVar1 = (double *)(lVar8 + uVar13 * 8);
          dVar7 = pdVar1[1];
          pdVar2 = (double *)(uVar10 + uVar13 * 8);
          dVar4 = pdVar2[1];
          pdVar3 = (double *)(uVar10 + uVar13 * 8);
          *pdVar3 = *pdVar1 + *pdVar2;
          pdVar3[1] = dVar7 + dVar4;
          uVar13 = uVar13 + 2;
        } while ((long)uVar13 < (long)uVar14);
      }
      if ((long)uVar11 <= (long)uVar14) {
        return true;
      }
      do {
        *(double *)(uVar10 + uVar14 * 8) =
             *(double *)(lVar8 + uVar14 * 8) + *(double *)(uVar10 + uVar14 * 8);
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The control and the gradient at time: ",0x26);
    poVar12 = std::ostream::_M_insert<double>(local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," have different dimensions.",0x1b);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              ("QuadraticLikeCost","costFirstPartialDerivativeWRTControl",(char *)local_1f8[0]);
  }
LAB_001642d0:
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)&local_138);
  return false;
}

Assistant:

bool QuadraticLikeCost::costFirstPartialDerivativeWRTControl(double time,
                                                                 const iDynTree::VectorDynSize& /*state*/,
                                                                 const iDynTree::VectorDynSize& control,
                                                                 iDynTree::VectorDynSize& partialDerivative)
        {
            partialDerivative.resize(control.size());
            partialDerivative.zero();
            bool isValid = false;

            if (m_timeVaryingControlHessian) {

                const MatrixDynSize &hessian = m_timeVaryingControlHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the control dimension.";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }
                toEigen(partialDerivative) += 0.5 * (toEigen(hessian) + toEigen(hessian).transpose()) * toEigen(control);
            }

            if (m_timeVaryingControlGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingControlGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (control.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control and the gradient at time: " << time << " have different dimensions.";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                toEigen(partialDerivative) += toEigen(gradient);
            }


            return true;
        }